

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Exporter::ExportScene(glTF2Exporter *this)

{
  pointer *ppRVar1;
  Scene *pSVar2;
  iterator __position;
  element_type *peVar3;
  Ref<glTF2::Scene> RVar4;
  Ref<glTF2::Node> local_28;
  
  RVar4 = glTF2::LazyDict<glTF2::Scene>::Create
                    (&((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->scenes,"defaultScene");
  peVar3 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((int)((ulong)((long)*(pointer *)
                           ((long)&(peVar3->nodes).mObjs.
                                   super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>
                                   ._M_impl.super__Vector_impl_data + 8) -
                   (long)(peVar3->nodes).mObjs.
                         super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    local_28.vector = &(peVar3->nodes).mObjs;
    pSVar2 = ((RVar4.vector)->super__Vector_base<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_>).
             _M_impl.super__Vector_impl_data._M_start[RVar4.index];
    local_28.index = 0;
    __position._M_current =
         *(pointer *)
          ((long)&(pSVar2->nodes).
                  super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                  ._M_impl + 8);
    if (__position._M_current ==
        *(pointer *)
         ((long)&(pSVar2->nodes).
                 super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                 ._M_impl + 0x10)) {
      std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
      _M_realloc_insert<glTF2::Ref<glTF2::Node>>
                ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
                 &pSVar2->nodes,__position,&local_28);
    }
    else {
      (__position._M_current)->vector = local_28.vector;
      *(ulong *)&(__position._M_current)->index = (ulong)(uint)local_28._12_4_ << 0x20;
      ppRVar1 = (pointer *)
                ((long)&(pSVar2->nodes).
                        super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                        ._M_impl + 8);
      *ppRVar1 = *ppRVar1 + 1;
    }
    peVar3 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (peVar3->scene).vector = RVar4.vector;
  (peVar3->scene).index = RVar4.index;
  return;
}

Assistant:

void glTF2Exporter::ExportScene()
{
    const char* sceneName = "defaultScene";
    Ref<Scene> scene = mAsset->scenes.Create(sceneName);

    // root node will be the first one exported (idx 0)
    if (mAsset->nodes.Size() > 0) {
        scene->nodes.push_back(mAsset->nodes.Get(0u));
    }

    // set as the default scene
    mAsset->scene = scene;
}